

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_map_get_size(JSContext *ctx,JSValue this_val,int magic)

{
  uint uVar1;
  long lVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  JSValue JVar6;
  int64_t iVar5;
  
  if ((((int)this_val.tag == -1) && (magic + 0x1fU == (uint)*(ushort *)((long)this_val.u.ptr + 6)))
     && (lVar2 = *(long *)((long)this_val.u.ptr + 0x30), lVar2 != 0)) {
    uVar1 = *(uint *)(lVar2 + 0x18);
    JVar4 = (JSValueUnion)(long)(int)uVar1;
    JVar3.float64 = (double)uVar1;
    if (-1 < (long)JVar4.ptr) {
      JVar3 = JVar4;
    }
    iVar5 = 7;
    if (-1 < (long)JVar4.ptr) {
      iVar5 = 0;
    }
    JVar6.tag = iVar5;
    JVar6.u.float64 = JVar3.float64;
    return JVar6;
  }
  JS_ThrowTypeErrorInvalidClass(ctx,magic + 0x1fU);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_map_get_size(JSContext *ctx, JSValueConst this_val, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    if (!s)
        return JS_EXCEPTION;
    return JS_NewUint32(ctx, s->record_count);
}